

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psvimg-create.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  time_t tVar3;
  size_t sVar4;
  uint local_610;
  uint local_60c;
  int i_1;
  int i;
  pthread_t pth2;
  pthread_t pth1;
  PsvMd_t md;
  int mfd;
  char path [1024];
  int fds [4];
  stat st;
  args_t args2;
  args_t args1;
  char **argv_local;
  int argc_local;
  
  if (argc < 7) {
    fprintf(_stderr,
            "usage: psvimg-create [-m metadata|-n name] [-A aid | -K key] inputdir outputdir\n");
    fprintf(_stderr,"  specify either a decrypted metadata file as a template or\n");
    fprintf(_stderr,"  a name and other metadata fields will retain default values\n");
    return 1;
  }
  iVar1 = strcmp(argv[1],"-m");
  if (iVar1 == 0) {
    md.unused_A0._4_4_ = open(argv[2],0);
    if (md.unused_A0._4_4_ < 0) {
      fprintf(_stderr,"metadata\n");
      return 1;
    }
    uVar2 = read_block(md.unused_A0._4_4_,&pth1,0xa8);
    if (uVar2 < 0xa8) {
      fprintf(_stderr,"invalid metadata size\n");
      return 1;
    }
    if (pth1._4_4_ != 2) {
      fprintf(_stderr,"metadata type not supported\n");
      close(md.unused_A0._4_4_);
      return 1;
    }
    uVar2 = read_block(md.unused_A0._4_4_,&md.unused_A0,4);
    if (uVar2 < 4) {
      fprintf(_stderr,"invalid metadata size\n");
      close(md.unused_A0._4_4_);
      return 1;
    }
    close(md.unused_A0._4_4_);
  }
  else {
    iVar1 = strcmp(argv[1],"-n");
    if (iVar1 != 0) {
      fprintf(_stderr,"you must specify either -m or -n!\n");
      return 1;
    }
    memset(&pth1,0,0xac);
    strncpy((char *)(md.psid + 8),argv[2],0x40);
    iVar1 = is_backup((char *)(md.psid + 8));
    pth1._0_4_ = 0xfee1900d;
    if (iVar1 != 0) {
      pth1._0_4_ = 0xfee1900e;
    }
    pth1._4_4_ = 2;
    md.psvimg_size = 2;
    md.unused_A0._0_4_ = 1;
    tVar3 = time((time_t *)0x0);
    srand((uint)tVar3);
    for (local_60c = 0; local_60c < 0x10; local_60c = local_60c + 1) {
      iVar1 = rand();
      md.iv[(long)(int)local_60c + -8] = (uint8_t)(iVar1 % 0xff);
    }
  }
  iVar1 = pipe((int *)(path + 0x3f8));
  if (iVar1 < 0) {
    fprintf(_stderr,"pipe 1\n");
    argv_local._4_4_ = 1;
  }
  else {
    args2.content_size._0_4_ = 0;
    args2.content_size._4_1_ = path[0x3fc];
    args2.content_size._5_1_ = path[0x3fd];
    args2.content_size._6_1_ = path[0x3fe];
    args2.content_size._7_1_ = path[0x3ff];
    iVar1 = stat(argv[6],(stat *)(fds + 2));
    if (iVar1 < 0) {
      mkdir(argv[6],0x1c0);
    }
    snprintf((char *)&md.add_data,0x400,"%s/%s.psvimg",argv[6],md.psid + 8);
    st.__glibc_reserved[2]._4_4_ = open((char *)&md.add_data,0x241,0x1a4);
    if (st.__glibc_reserved[2]._4_4_ < 0) {
      fprintf(_stderr,"psvimg output\n");
      argv_local._4_4_ = 1;
    }
    else {
      st.__glibc_reserved[2]._0_1_ = path[0x3f8];
      st.__glibc_reserved[2]._1_1_ = path[0x3f9];
      st.__glibc_reserved[2]._2_1_ = path[0x3fa];
      st.__glibc_reserved[2]._3_1_ = path[0x3fb];
      iVar1 = strcmp(argv[3],"-K");
      if (iVar1 == 0) {
        iVar1 = parse_key(argv[4],(uint8_t *)&args2);
        if (iVar1 < 0) {
          fprintf(_stderr,"invalid key\n");
          return 1;
        }
      }
      else {
        iVar1 = strcmp(argv[3],"-A");
        if (iVar1 != 0) {
          fprintf(_stderr,"you must specify either -A or -K!\n");
          return 1;
        }
        iVar1 = generate_key_from_aid(argv[4],(uint8_t *)&args2);
        if (iVar1 < 0) {
          fprintf(_stderr,"invalid aid\n");
          return 1;
        }
      }
      args2.key[0x18] = (undefined1)md.total_size;
      args2.key[0x19] = md.total_size._1_1_;
      args2.key[0x1a] = md.total_size._2_1_;
      args2.key[0x1b] = md.total_size._3_1_;
      args2.key[0x1c] = md.total_size._4_1_;
      args2.key[0x1d] = md.total_size._5_1_;
      args2.key[0x1e] = md.total_size._6_1_;
      args2.key[0x1f] = md.total_size._7_1_;
      args2.iv[0] = md.iv[0];
      args2.iv[1] = md.iv[1];
      args2.iv[2] = md.iv[2];
      args2.iv[3] = md.iv[3];
      args2.iv[4] = md.iv[4];
      args2.iv[5] = md.iv[5];
      args2.iv[6] = md.iv[6];
      args2.iv[7] = md.iv[7];
      pthread_create(&pth2,(pthread_attr_t *)0x0,encrypt_thread,st.__glibc_reserved + 2);
      pthread_create((pthread_t *)&i_1,(pthread_attr_t *)0x0,pack_thread,&args2.content_size);
      pthread_join(_i_1,(void **)0x0);
      pthread_join(pth2,(void **)0x0);
      iVar1 = stat((char *)&md.add_data,(stat *)(fds + 2));
      if (iVar1 < 0) {
        fprintf(_stderr,"stat\n");
        argv_local._4_4_ = 1;
      }
      else {
        fprintf(_stderr,"created %s (size: %llx, content size: %zx)\n",&md.add_data,st.st_rdev,0);
        md.version = 0;
        md.name[0x38] = (undefined1)st.st_rdev;
        md.name[0x39] = st.st_rdev._1_1_;
        md.name[0x3a] = st.st_rdev._2_1_;
        md.name[0x3b] = st.st_rdev._3_1_;
        md.name[0x3c] = st.st_rdev._4_1_;
        md.name[0x3d] = st.st_rdev._5_1_;
        md.name[0x3e] = st.st_rdev._6_1_;
        md.name[0x3f] = st.st_rdev._7_1_;
        snprintf((char *)&md.add_data,0x400,"%s/%s.psvmd",argv[6],md.psid + 8);
        iVar1 = pipe((int *)(path + 0x3f8));
        if (iVar1 < 0) {
          fprintf(_stderr,"pipe 2\n");
          argv_local._4_4_ = 1;
        }
        else {
          iVar1 = pipe(fds);
          if (iVar1 < 0) {
            fprintf(_stderr,"pipe 3\n");
            argv_local._4_4_ = 1;
          }
          else {
            args2.content_size._0_1_ = path[0x3f8];
            args2.content_size._1_1_ = path[0x3f9];
            args2.content_size._2_1_ = path[0x3fa];
            args2.content_size._3_1_ = path[0x3fb];
            args2.content_size._4_4_ = fds[1];
            st.__glibc_reserved[2]._0_4_ = fds[0];
            st.__glibc_reserved[2]._4_4_ = open((char *)&md.add_data,0x241,0x1a4);
            if (st.__glibc_reserved[2]._4_4_ < 0) {
              fprintf(_stderr,"psvmd output\n");
              argv_local._4_4_ = 1;
            }
            else {
              for (local_610 = 0; local_610 < 0x10; local_610 = local_610 + 1) {
                iVar1 = rand();
                args2.key[(long)(int)local_610 + 0x18] = (uchar)(iVar1 % 0xff);
              }
              pthread_create(&pth2,(pthread_attr_t *)0x0,encrypt_thread,st.__glibc_reserved + 2);
              pthread_create((pthread_t *)&i_1,(pthread_attr_t *)0x0,compress_thread,
                             &args2.content_size);
              write_block(path._1020_4_,&pth1,0xac);
              close(path._1020_4_);
              pthread_join(_i_1,(void **)0x0);
              pthread_join(pth2,(void **)0x0);
              fprintf(_stderr,"created %s\n",&md.add_data);
              iVar1 = is_backup((char *)(md.psid + 8));
              if (iVar1 != 0) {
                snprintf((char *)&md.add_data,0x400,"%s/%s.psvinf",argv[6],md.psid + 8);
                iVar1 = open((char *)&md.add_data,0x241,0x1a4);
                md.unused_A0._4_4_ = iVar1;
                sVar4 = strnlen((char *)(md.psid + 8),0x40);
                write_block(iVar1,md.psid + 8,sVar4 + 1);
                close(md.unused_A0._4_4_);
                fprintf(_stderr,"created %s\n",&md.add_data);
              }
              argv_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[]) {
  args_t args1, args2;
  struct stat st;
  int fds[4];
  char path[MAX_PATH_LEN];
  int mfd;
  PsvMd_t md;
  pthread_t pth1, pth2;

  if (argc < 7) {
    fprintf(stderr, "usage: psvimg-create [-m metadata|-n name] [-A aid | -K key] inputdir outputdir\n");
    fprintf(stderr, "  specify either a decrypted metadata file as a template or\n");
    fprintf(stderr, "  a name and other metadata fields will retain default values\n");
    return 1;
  }

  // TODO: support more types
  if (strcmp(argv[1], "-m") == 0) {
    mfd = open(argv[2], O_RDONLY | O_BINARY);
    if (mfd < 0) {
      fprintf(stderr, "metadata\n");
      return 1;
    }
    if (read_block(mfd, &md, sizeof(md) - sizeof(md.add_data)) < sizeof(md) - sizeof(md.add_data)) {
      fprintf(stderr, "invalid metadata size\n");
      return 1;
    }
    if (md.type != 2) {
      fprintf(stderr, "metadata type not supported\n");
      close(mfd);
      return 1;
    }
    if (read_block(mfd, &md.add_data, sizeof(md.add_data)) < sizeof(md.add_data)) {
      fprintf(stderr, "invalid metadata size\n");
      close(mfd);
      return 1;
    }
    close(mfd);
  } else if (strcmp(argv[1], "-n") == 0) {
    memset(&md, 0, sizeof(md));
    strncpy(md.name, argv[2], sizeof(md.name));
    md.magic = is_backup(md.name) ? PSVMD_BACKUP_MAGIC : PSVMD_CONTENT_MAGIC;
    md.type = 2;
    md.version = 2;
    md.add_data = 1;
    srand(time(NULL));
    for (int i = 0; i < sizeof(md.iv); i++) {
      md.iv[i] = rand() % 0xFF;
    }
  } else {
    fprintf(stderr, "you must specify either -m or -n!\n");
    return 1;
  }

  if (pipe(fds) < 0) {
    fprintf(stderr, "pipe 1\n");
    return 1;
  }

  args1.in = 0;
  args1.prefix = argv[5];
  args1.content_size = 0;
  args1.out = fds[1];

  if (stat(argv[6], &st) < 0) {
    mkdir(argv[6], 0700);
  }

  snprintf(path, sizeof(path), "%s/%s.psvimg", argv[6], md.name);

  args2.out = open(path, O_WRONLY | O_CREAT | O_BINARY | O_TRUNC, 0644);
  if (args2.out < 0) {
    fprintf(stderr, "psvimg output\n");
    return 1;
  }
  args2.in = fds[0];

  if (strcmp(argv[3], "-K") == 0) {
    if (parse_key(argv[4], args2.key) < 0) {
      fprintf(stderr, "invalid key\n");
      return 1;
    }
  } else if (strcmp(argv[3], "-A") == 0) {
    if (generate_key_from_aid(argv[4], args2.key) < 0) {
      fprintf(stderr, "invalid aid\n");
      return 1;
    }
  } else {
    fprintf(stderr, "you must specify either -A or -K!\n");
    return 1;
  }

  memcpy(args2.iv, md.iv, sizeof(args2.iv));

  pthread_create(&pth1, NULL, encrypt_thread, &args2);
  pthread_create(&pth2, NULL, pack_thread, &args1);

  pthread_join(pth2, NULL);
  pthread_join(pth1, NULL);

  if (stat(path, &st) < 0) {
    fprintf(stderr, "stat\n");
    return 1;
  }
  fprintf(stderr, "created %s (size: %llx, content size: %zx)\n", path, st.st_size, args1.content_size);
  md.total_size = args1.content_size;
  md.psvimg_size = st.st_size;

  // now create the psvmd
  snprintf(path, sizeof(path), "%s/%s.psvmd", argv[6], md.name);

  if (pipe(fds) < 0) {
    fprintf(stderr, "pipe 2\n");
    return 1;
  }
  if (pipe(&fds[2]) < 0) {
    fprintf(stderr, "pipe 3\n");
    return 1;
  }

  args1.in = fds[0];
  args1.out = fds[3];

  args2.in = fds[2];
  args2.out = open(path, O_WRONLY | O_CREAT | O_BINARY | O_TRUNC, 0644);
  if (args2.out < 0) {
    fprintf(stderr, "psvmd output\n");
    return 1;
  }
  for (int i = 0; i < sizeof(md.iv); i++) {
    args2.iv[i] = rand() % 0xFF;
  }

  pthread_create(&pth1, NULL, encrypt_thread, &args2);
  pthread_create(&pth2, NULL, compress_thread, &args1);
  write_block(fds[1], &md, sizeof(md));
  close(fds[1]);

  pthread_join(pth2, NULL);
  pthread_join(pth1, NULL);

  
  fprintf(stderr, "created %s\n", path);

  // finally create the psvinf
  if (is_backup(md.name)) {
    snprintf(path, sizeof(path), "%s/%s.psvinf", argv[6], md.name);
    mfd = open(path, O_WRONLY | O_CREAT | O_BINARY | O_TRUNC, 0644);
    write_block(mfd, md.name, strnlen(md.name, 64) + 1);
    close(mfd);
    fprintf(stderr, "created %s\n", path);
  }

  return 0;
}